

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O2

EStatusCode __thiscall OpenTypeFileInput::ReadHMtx(OpenTypeFileInput *this)

{
  OpenTypePrimitiveReader *this_00;
  EStatusCode EVar1;
  iterator iVar2;
  HMtxTable pHVar3;
  Trace *this_01;
  ulong uVar4;
  long lVar5;
  unsigned_long local_28;
  
  local_28 = GetTag(this,"hmtx");
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_TableEntry>,_std::_Select1st<std::pair<const_unsigned_long,_TableEntry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
          ::find(&(this->mTables)._M_t,&local_28);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mTables)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = Trace::DefaultTrace();
    Trace::TraceToLog(this_01,"OpenTypeFileInput::ReadHMtx, could not find hmtx table");
    EVar1 = eFailure;
  }
  else {
    this_00 = &this->mPrimitivesReader;
    OpenTypePrimitiveReader::SetOffset(this_00,(LongFilePositionType)iVar2._M_node[1]._M_left);
    pHVar3 = (HMtxTable)operator_new__((ulong)(this->mMaxp).NumGlyphs << 2);
    this->mHMtx = pHVar3;
    lVar5 = 2;
    for (uVar4 = 0; uVar4 < (this->mHHea).NumberOfHMetrics; uVar4 = uVar4 + 1) {
      OpenTypePrimitiveReader::ReadUSHORT
                (this_00,(unsigned_short *)((long)this->mHMtx + lVar5 + -2));
      OpenTypePrimitiveReader::ReadSHORT
                (this_00,(short *)((long)&this->mHMtx->AdvanceWidth + lVar5));
      lVar5 = lVar5 + 4;
    }
    for (; uVar4 < (this->mMaxp).NumGlyphs; uVar4 = uVar4 + 1) {
      pHVar3 = this->mHMtx;
      pHVar3[uVar4].AdvanceWidth = pHVar3[(ulong)(this->mHHea).NumberOfHMetrics - 1].AdvanceWidth;
      OpenTypePrimitiveReader::ReadSHORT(this_00,(short *)((long)&pHVar3->AdvanceWidth + lVar5));
      lVar5 = lVar5 + 4;
    }
    EVar1 = OpenTypePrimitiveReader::GetInternalState(this_00);
  }
  return EVar1;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadHMtx()
{
	ULongToTableEntryMap::iterator it = mTables.find(GetTag("hmtx"));
	if(it == mTables.end())
	{
		TRACE_LOG("OpenTypeFileInput::ReadHMtx, could not find hmtx table");
		return PDFHummus::eFailure;
	}

	mPrimitivesReader.SetOffset(it->second.Offset);

	mHMtx = new HMtxTableEntry[mMaxp.NumGlyphs];

	unsigned int i=0;

	for(; i < mHHea.NumberOfHMetrics;++i)
	{
		mPrimitivesReader.ReadUSHORT(mHMtx[i].AdvanceWidth);
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	for(; i < mMaxp.NumGlyphs; ++i)
	{
		mHMtx[i].AdvanceWidth = mHMtx[mHHea.NumberOfHMetrics-1].AdvanceWidth;
		mPrimitivesReader.ReadSHORT(mHMtx[i].LeftSideBearing);
	}

	return mPrimitivesReader.GetInternalState();	
}